

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O0

Token __thiscall slang::parsing::Preprocessor::nextRaw(Preprocessor *this)

{
  string_view rawText;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia_00;
  Token token_00;
  bool bVar1;
  iterator pTVar2;
  pointer pTVar3;
  reference pTVar4;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *src;
  Info *in_RDI;
  Token TVar5;
  unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_> *nextSource;
  anon_class_16_2_db6d24d4 appendTrivia;
  SmallVector<slang::parsing::Trivia,_8UL> trivia;
  anon_class_8_1_8991fb9c checkBranchStack;
  Token token;
  unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_> *source;
  Token result;
  undefined7 in_stack_fffffffffffffdf8;
  TriviaKind in_stack_fffffffffffffdff;
  Preprocessor *in_stack_fffffffffffffe00;
  span<slang::parsing::Trivia,_18446744073709551615UL> *in_stack_fffffffffffffe08;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffe10;
  SourceLocation this_00;
  __extent_storage<18446744073709551615UL> _Var6;
  anon_class_16_2_db6d24d4 *in_stack_fffffffffffffe60;
  iterator pTVar7;
  undefined8 in_stack_fffffffffffffe68;
  KeywordVersion in_stack_fffffffffffffe8f;
  Lexer *in_stack_fffffffffffffe90;
  SmallVectorBase<slang::parsing::Trivia> local_e8 [4];
  Token local_48;
  reference local_30;
  Token local_10;
  
  bVar1 = Token::operator_cast_to_bool((Token *)0x3613b8);
  if (bVar1) {
    Token::Token((Token *)in_stack_fffffffffffffe00);
    local_10 = std::exchange<slang::parsing::Token,slang::parsing::Token>
                         ((Token *)in_stack_fffffffffffffe00,
                          (Token *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
  }
  else if (in_RDI[0x1d].rawTextPtr == (char *)0x0) {
    local_30 = SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
               ::back((SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                       *)&in_RDI[0xf].location);
    std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>::operator->
              ((unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_> *)
               0x3614b6);
    std::vector<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>::
    back((vector<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_> *)
         in_stack_fffffffffffffe00);
    local_48 = Lexer::lex(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8f);
    local_10 = local_48;
    if (local_48.kind == EndOfFile) {
      popSource(in_stack_fffffffffffffe00);
      bVar1 = SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
              ::empty((SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                       *)&in_RDI[0xf].location);
      if (bVar1) {
        nextRaw::anon_class_8_1_8991fb9c::operator()(in_stack_fffffffffffffe10);
        local_10 = local_48;
      }
      else {
        _Var6._M_extent_value = (size_t)local_e8;
        SmallVector<slang::parsing::Trivia,_8UL>::SmallVector
                  ((SmallVector<slang::parsing::Trivia,_8UL> *)0x361586);
        TVar5.info = in_RDI;
        TVar5.kind = (short)in_stack_fffffffffffffe68;
        TVar5._2_1_ = (char)((ulong)in_stack_fffffffffffffe68 >> 0x10);
        TVar5.numFlags.raw = (char)((ulong)in_stack_fffffffffffffe68 >> 0x18);
        TVar5.rawLen = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
        nextRaw::anon_class_16_2_db6d24d4::operator()(in_stack_fffffffffffffe60,TVar5);
        do {
          pTVar3 = (pointer)SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                            ::back((SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                                    *)&in_RDI[0xf].location);
          std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>::
          operator->((unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>
                      *)0x361605);
          std::
          vector<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>::
          back((vector<slang::parsing::KeywordVersion,_std::allocator<slang::parsing::KeywordVersion>_>
                *)in_stack_fffffffffffffe00);
          local_48 = Lexer::lex(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8f);
          token_00.info = in_RDI;
          token_00.kind = (short)in_stack_fffffffffffffe68;
          token_00._2_1_ = (char)((ulong)in_stack_fffffffffffffe68 >> 0x10);
          token_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffe68 >> 0x18);
          token_00.rawLen = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
          TVar5 = local_48;
          nextRaw::anon_class_16_2_db6d24d4::operator()(in_stack_fffffffffffffe60,token_00);
          if (local_48.kind != EndOfFile) goto LAB_003616f9;
          popSource(in_stack_fffffffffffffe00);
          bVar1 = SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                  ::empty((SmallVectorBase<std::unique_ptr<slang::parsing::Lexer,_std::default_delete<slang::parsing::Lexer>_>_>
                           *)&in_RDI[0xf].location);
        } while (!bVar1);
        nextRaw::anon_class_8_1_8991fb9c::operator()(in_stack_fffffffffffffe10);
LAB_003616f9:
        bVar1 = SmallVectorBase<slang::parsing::Trivia>::empty(local_e8);
        if ((bVar1) ||
           (pTVar4 = SmallVectorBase<slang::parsing::Trivia>::back(local_e8), src = extraout_RDX,
           pTVar4->kind != EndOfLine)) {
          sv((char *)in_stack_fffffffffffffe00,
             CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
          rawText._M_str = (char *)in_stack_fffffffffffffe10;
          rawText._M_len = (size_t)in_stack_fffffffffffffe08;
          Trivia::Trivia((Trivia *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdff,rawText);
          SmallVectorBase<slang::parsing::Trivia>::push_back
                    ((SmallVectorBase<slang::parsing::Trivia> *)in_stack_fffffffffffffe00,
                     (Trivia *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
          src = extraout_RDX_00;
        }
        this_00 = in_RDI->location;
        SmallVectorBase<slang::parsing::Trivia>::copy(local_e8,(EVP_PKEY_CTX *)this_00,src);
        std::span<const_slang::parsing::Trivia,_18446744073709551615UL>::
        span<slang::parsing::Trivia,_18446744073709551615UL>
                  ((span<const_slang::parsing::Trivia,_18446744073709551615UL> *)this_00,
                   in_stack_fffffffffffffe08);
        trivia_00._M_extent._M_extent_value = _Var6._M_extent_value;
        trivia_00._M_ptr = pTVar3;
        local_10 = Token::withTrivia(TVar5._0_8_,(BumpAllocator *)TVar5.info,trivia_00);
        SmallVector<slang::parsing::Trivia,_8UL>::~SmallVector
                  ((SmallVector<slang::parsing::Trivia,_8UL> *)0x361831);
      }
    }
  }
  else {
    local_10 = *(Token *)in_RDI[0x1d].rawTextPtr;
    in_RDI[0x1d].rawTextPtr = in_RDI[0x1d].rawTextPtr + 0x10;
    pTVar7 = (iterator)in_RDI[0x1d].rawTextPtr;
    pTVar2 = SmallVectorBase<slang::parsing::Token>::end
                       ((SmallVectorBase<slang::parsing::Token> *)&in_RDI[0x19].location);
    if (pTVar7 == pTVar2) {
      in_RDI[0x1d].rawTextPtr = (char *)0x0;
      SmallVectorBase<slang::parsing::Token>::clear
                ((SmallVectorBase<slang::parsing::Token> *)in_stack_fffffffffffffe00);
    }
  }
  return local_10;
}

Assistant:

Token Preprocessor::nextRaw() {
    // it's possible we have a token buffered from looking ahead when handling a directive
    if (currentToken)
        return std::exchange(currentToken, Token());

    // if we just expanded a macro we'll have tokens from that to return
    if (currentMacroToken) {
        auto result = *currentMacroToken;
        currentMacroToken++;
        if (currentMacroToken == expandedTokens.end()) {
            currentMacroToken = nullptr;
            expandedTokens.clear();
        }
        return result;
    }

    // if this assert fires, the user disregarded an EoF and kept calling next()
    SLANG_ASSERT(!lexerStack.empty());

    // Pull the next token from the active source.
    // This is the common case.
    auto& source = lexerStack.back();
    auto token = source->lex(keywordVersionStack.back());
    if (token.kind != TokenKind::EndOfFile)
        return token;

    auto checkBranchStack = [&] {
        if (!branchStack.empty())
            addDiag(diag::MissingEndIfDirective, branchStack.back().directive.range());
    };

    // don't return EndOfFile tokens for included files, fall
    // through to loop to merge trivia
    popSource();
    if (lexerStack.empty()) {
        checkBranchStack();
        return token;
    }

    // Rare case: we have an EoF from an include file... we don't want to return
    // that one, but we do want to merge its trivia with whatever comes next.
    SmallVector<Trivia, 8> trivia;
    auto appendTrivia = [&trivia, this](Token token) {
        trivia.append_range(token.trivia());
        SourceLocation loc = token.location();
        if (!token.trivia().empty())
            trivia.back() = trivia.back().withLocation(alloc, loc);
    };

    appendTrivia(token);

    while (true) {
        auto& nextSource = lexerStack.back();
        token = nextSource->lex(keywordVersionStack.back());
        appendTrivia(token);
        if (token.kind != TokenKind::EndOfFile)
            break;

        popSource();
        if (lexerStack.empty()) {
            checkBranchStack();
            break;
        }
    }

    // Ensure EoL at the end of trivia to prevent inlining issues
    if (trivia.empty() || trivia.back().kind != TriviaKind::EndOfLine)
        trivia.push_back(Trivia(TriviaKind::EndOfLine, ""sv));

    // finally found a real token to return, so update trivia and get out of here
    return token.withTrivia(alloc, trivia.copy(alloc));
}